

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O3

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wchar_t **in_R9;
  AssertionResult iutest_ar;
  String host;
  String test;
  allocator<char> local_231;
  AssertionResult local_230;
  AssertionHelper local_208;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [392];
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1b8,(wchar_t *)text<wchar_t>::test,(allocator<wchar_t> *)local_198);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_1d8,(wchar_t *)text<wchar_t>::host,(allocator<wchar_t> *)local_198);
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = text<wchar_t>::test;
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)0x338ca4,"TestFixture::Text::test",local_198,
             (wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xe8;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  paVar1 = &local_230.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)0x338ca4,"test",local_198,(wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xe9;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = text<wchar_t>::test;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0];
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)"TestFixture::Text::test","host",local_198,
             (wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xea;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = text<wchar_t>::test;
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)0x338ca4,"TestFixture::Text::test",local_198,
             (wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xec;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)0x338ca4,"test",local_198,(wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xed;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = text<wchar_t>::test;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0];
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)"TestFixture::Text::test","host",local_198,
             (wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xee;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = text<wchar_t>::test;
  iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_230,(StrCaseNeHelper *)0x338ca4,"TestFixture::Text::test",local_198,
             (wchar_t **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xf0;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      local_230.m_message.field_2._M_allocated_capacity + 1);
    }
    local_198._0_8_ = local_1d8[0];
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
    iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
              (&local_230,(StrCaseNeHelper *)0x338ca4,"test",local_198,(wchar_t **)&local_208,in_R9)
    ;
    if (local_230.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0xf1;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_230.m_message._M_dataplus._M_p,
                        local_230.m_message.field_2._M_allocated_capacity + 1);
      }
      local_198._0_8_ = text<wchar_t>::test;
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0]
      ;
      iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
                (&local_230,(StrCaseNeHelper *)"TestFixture::Text::test","host",local_198,
                 (wchar_t **)&local_208,in_R9);
      if (local_230.m_result != false) goto LAB_002e45a7;
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0xf2;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
LAB_002e45a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] * 4 + 4);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String host = TestFixture::Text::host;
    IUTEST_INFORM_STRCASENE(host, TestFixture::Text::test);
    IUTEST_INFORM_STRCASENE(host, test);
    IUTEST_INFORM_STRCASENE(TestFixture::Text::test, host);

    IUTEST_EXPECT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASENE(host, test);
    IUTEST_EXPECT_STRCASENE(TestFixture::Text::test, host);

    IUTEST_ASSERT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASENE(host, test);
    IUTEST_ASSERT_STRCASENE(TestFixture::Text::test, host);
}